

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_trainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t parameters)

{
  uint uVar1;
  ZDICT_cover_params_t parameters_00;
  size_t sVar2;
  COVER_map_pair_t *__s;
  ulong uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 in_stack_ffffffffffffff38;
  COVER_map_t local_a0;
  COVER_ctx_t ctx;
  
  g_displayLevel = parameters.zParams.notificationLevel;
  if (parameters.d != 0) {
    if (((parameters.d <= parameters.k) && (parameters.k != 0)) &&
       (parameters.k <= dictBufferCapacity)) {
      if (nbSamples == 0) {
        if ((int)parameters.zParams.notificationLevel < 1) {
          return 0xffffffffffffffb8;
        }
        ZDICT_trainFromBuffer_cover_cold_5();
        return 0xffffffffffffffb8;
      }
      if (dictBufferCapacity < 0x100) {
        if ((int)parameters.zParams.notificationLevel < 1) {
          return 0xffffffffffffffba;
        }
        ZDICT_trainFromBuffer_cover_cold_4();
        return 0xffffffffffffffba;
      }
      sVar2 = COVER_ctx_init(&ctx,samplesBuffer,samplesSizes,nbSamples,parameters.d,1.0);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      COVER_warnOnSmallCorpus(dictBufferCapacity,ctx.suffixSize,g_displayLevel);
      uVar4 = (parameters.k - parameters.d) + 1;
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      local_a0.sizeLog = (uVar1 ^ 0xffffffe0) + 0x22;
      local_a0.size = 4 << ((byte)uVar1 & 0x1f);
      uVar3 = (ulong)local_a0.size;
      local_a0.sizeMask = local_a0.size - 1;
      __s = (COVER_map_pair_t *)malloc(uVar3 << 3);
      local_a0.data = __s;
      if (__s != (COVER_map_pair_t *)0x0) {
        uVar5 = 0x184ffd;
        memset(__s,0xff,uVar3 << 3);
        if (1 < g_displayLevel) {
          uVar5 = 0x1850cc;
          ZDICT_trainFromBuffer_cover_cold_1();
        }
        parameters_00.d = 0;
        parameters_00.k = parameters.d;
        parameters_00.steps = (int)uVar5;
        parameters_00.nbThreads = (int)((ulong)uVar5 >> 0x20);
        parameters_00.splitPoint = (double)in_stack_ffffffffffffff38;
        parameters_00._24_8_ = __s;
        parameters_00.zParams._0_8_ = dictBuffer;
        parameters_00._40_8_ = samplesBuffer;
        sVar2 = COVER_buildDictionary
                          (&ctx,ctx.freqs,&local_a0,dictBuffer,dictBufferCapacity,parameters_00);
        sVar2 = ZDICT_finalizeDictionary
                          (dictBuffer,dictBufferCapacity,(void *)(sVar2 + (long)dictBuffer),
                           dictBufferCapacity - sVar2,samplesBuffer,samplesSizes,nbSamples,
                           parameters.zParams);
        if ((sVar2 < 0xffffffffffffff89) && (1 < g_displayLevel)) {
          ZDICT_trainFromBuffer_cover_cold_2();
        }
        COVER_ctx_destroy(&ctx);
        free(__s);
        return sVar2;
      }
      if (0 < g_displayLevel) {
        ZDICT_trainFromBuffer_cover_cold_3();
      }
      COVER_ctx_destroy(&ctx);
      return 0xffffffffffffffc0;
    }
  }
  if (0 < (int)parameters.zParams.notificationLevel) {
    ZDICT_trainFromBuffer_cover_cold_6();
  }
  return 0xffffffffffffffd6;
}

Assistant:

ZDICTLIB_API size_t ZDICT_trainFromBuffer_cover(
    void *dictBuffer, size_t dictBufferCapacity,
    const void *samplesBuffer, const size_t *samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t parameters)
{
  BYTE* const dict = (BYTE*)dictBuffer;
  COVER_ctx_t ctx;
  COVER_map_t activeDmers;
  parameters.splitPoint = 1.0;
  /* Initialize global data */
  g_displayLevel = (int)parameters.zParams.notificationLevel;
  /* Checks */
  if (!COVER_checkParameters(parameters, dictBufferCapacity)) {
    DISPLAYLEVEL(1, "Cover parameters incorrect\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  /* Initialize context and activeDmers */
  {
    size_t const initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                      parameters.d, parameters.splitPoint);
    if (ZSTD_isError(initVal)) {
      return initVal;
    }
  }
  COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, g_displayLevel);
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    COVER_ctx_destroy(&ctx);
    return ERROR(memory_allocation);
  }

  DISPLAYLEVEL(2, "Building dictionary\n");
  {
    const size_t tail =
        COVER_buildDictionary(&ctx, ctx.freqs, &activeDmers, dictBuffer,
                              dictBufferCapacity, parameters);
    const size_t dictionarySize = ZDICT_finalizeDictionary(
        dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
        samplesBuffer, samplesSizes, nbSamples, parameters.zParams);
    if (!ZSTD_isError(dictionarySize)) {
      DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                   (unsigned)dictionarySize);
    }
    COVER_ctx_destroy(&ctx);
    COVER_map_destroy(&activeDmers);
    return dictionarySize;
  }
}